

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O1

string * __thiscall
yactfr::internal::SaveValInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,SaveValInstr *this,Size param_1)

{
  ostream *poVar1;
  string rProp;
  ostringstream ss;
  char *local_1d8;
  long local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  long *local_1b8 [2];
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," ",1);
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"pos","");
  local_1d0 = 0;
  local_1c8 = '\0';
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,0x2abc22);
  std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8[0]);
  std::__cxx11::string::append((char *)&local_1d8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1d8,local_1d0);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string SaveValInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << " " << _strProp("pos") << _pos << " " << std::endl;
    return ss.str();
}